

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  long in_RDI;
  FieldDescriptor *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  FieldDescriptor *in_stack_00000048;
  FieldDescriptor *in_stack_00000068;
  Printer *in_stack_00000070;
  FieldDescriptor *in_stack_000000e0;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  anon_unknown_5::ValueField(in_stack_000000e0);
  JVar2 = GetJavaType(in_stack_00000048);
  if (JVar2 == JAVATYPE_ENUM) {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
    bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x58a89f);
    if (bVar1) {
      io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
      WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
      io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
      WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
      io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
      WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
      io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    }
  }
  else {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  anon_unknown_5::ValueField(in_stack_000000e0);
  JVar2 = GetJavaType(in_stack_00000048);
  if (JVar2 == JAVATYPE_ENUM) {
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
    bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x58ab3b);
    if (bVar1) {
      WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
      io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    }
  }
  else {
    WriteFieldDocComment(in_stack_00000070,in_stack_00000068);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$DefaultEntryHolder {\n"
      "  static final com.google.protobuf.MapEntryLite<\n"
      "      $type_parameters$> defaultEntry =\n"
      "          com.google.protobuf.MapEntryLite\n"
      "          .<$type_parameters$>newDefaultInstance(\n"
      "              $key_wire_type$,\n"
      "              $key_default_value$,\n"
      "              $value_wire_type$,\n"
      "              $value_default_value$);\n"
      "}\n");
  printer->Print(variables_,
                 "private com.google.protobuf.MapFieldLite<\n"
                 "    $type_parameters$> $name$_ =\n"
                 "        com.google.protobuf.MapFieldLite.emptyMapField();\n"
                 "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
                 "internalGet$capitalized_name$() {\n"
                 "  return $name$_;\n"
                 "}\n"
                 "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
                 "internalGetMutable$capitalized_name$() {\n"
                 "  if (!$name$_.isMutable()) {\n"
                 "    $name$_ = $name$_.mutableCopy();\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$\n"
                 "public int ${$get$capitalized_name$Count$}$() {\n"
                 "  return internalGet$capitalized_name$().size();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$\n"
                 "public boolean ${$contains$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  return internalGet$capitalized_name$().containsKey(key);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "private static final\n"
        "com.google.protobuf.Internal.MapAdapter.Converter<\n"
        "    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n"
        "        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n"
        "            $value_enum_type$.internalGetValueMap(),\n"
        "            $unrecognized_value$);\n");
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Deprecated\n"
                   "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
                   "${$get$capitalized_name$$}$() {\n"
                   "  return get$capitalized_name$Map();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$get$capitalized_name$Map$}$() {\n"
        "  return java.util.Collections.unmodifiableMap(\n"
        "      new com.google.protobuf.Internal.MapAdapter<\n"
        "        $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "            internalGet$capitalized_name$(),\n"
        "            $name$ValueConverter));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_enum_type$ ${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$Value$}$() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$ValueMap$}$() {\n"
          "  return java.util.Collections.unmodifiableMap(\n"
          "      internalGet$capitalized_name$());\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public $value_type$ ${$get$capitalized_name$ValueOrDefault$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public $value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Override\n"
                   "@java.lang.Deprecated\n"
                   "public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$$}$() {\n"
                   "  return get$capitalized_name$Map();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$\n"
                   "public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return java.util.Collections.unmodifiableMap(\n"
                   "      internalGet$capitalized_name$());\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_type$ ${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$\n"
                   "public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
                   "    $key_type$ key) {\n"
                   "  $key_null_check$\n"
                   "  java.util.Map<$type_parameters$> map =\n"
                   "      internalGet$capitalized_name$();\n"
                   "  if (!map.containsKey(key)) {\n"
                   "    throw new java.lang.IllegalArgumentException();\n"
                   "  }\n"
                   "  return map.get(key);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  // Generate private setters for the builder to proxy into.
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "private java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "getMutable$capitalized_name$Map() {\n"
        "  return new com.google.protobuf.Internal.MapAdapter<\n"
        "      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "          internalGetMutable$capitalized_name$(),\n"
        "          $name$ValueConverter);\n"
        "}\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "private java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "getMutable$capitalized_name$ValueMap() {\n"
          "  return internalGetMutable$capitalized_name$();\n"
          "}\n");
    }
  } else {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "private java.util.Map<$type_parameters$>\n"
                   "getMutable$capitalized_name$Map() {\n"
                   "  return internalGetMutable$capitalized_name$();\n"
                   "}\n");
  }
}